

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O1

int mputchar(mstring *s,int ch)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  
  if ((s != (mstring *)0x0) && (pcVar3 = s->base, pcVar3 != (char *)0x0)) {
    ppcVar1 = &s->ptr;
    if (s->ptr == s->end) {
      iVar2 = (int)s->end - (int)pcVar3;
      pcVar3 = (char *)realloc(pcVar3,(long)(iVar2 * 2 + 8));
      s->base = pcVar3;
      if (pcVar3 == (char *)0x0) {
        *ppcVar1 = (char *)0x0;
        s->end = (char *)0x0;
        return ch;
      }
      s->ptr = pcVar3 + iVar2;
      s->end = pcVar3 + iVar2 + (long)iVar2 + 8;
    }
    pcVar3 = *ppcVar1;
    *ppcVar1 = pcVar3 + 1;
    *pcVar3 = (char)ch;
  }
  return ch;
}

Assistant:

int mputchar(struct mstring *s, int ch)
{
    if (!s || !s->base) return ch;
    if (s->ptr == s->end) {
	int len = s->end - s->base;
	if ((s->base = realloc(s->base, len+len+TAIL))) {
	    s->ptr = s->base + len;
	    s->end = s->base + len+len+TAIL; }
	else {
	    s->ptr = s->end = 0;
	    return ch; } }
    *s->ptr++ = ch;
    return ch;
}